

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::IntegerFunctionTestInstance::IntegerFunctionTestInstance
          (IntegerFunctionTestInstance *this,Context *context,ShaderType shaderType,ShaderSpec *spec
          ,int numValues,char *name)

{
  ShaderExecutor *pSVar1;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__IntegerFunctionTestInstance_00be0410;
  this->m_shaderType = shaderType;
  ShaderSpec::ShaderSpec(&this->m_spec,spec);
  this->m_numValues = numValues;
  this->m_name = name;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  pSVar1 = createExecutor(context,this->m_shaderType,&this->m_spec,(VkDescriptorSetLayout)0x0);
  (this->m_executor).
  super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  .m_data.ptr = pSVar1;
  return;
}

Assistant:

IntegerFunctionTestInstance		(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
									: TestInstance	(context)
									, m_shaderType	(shaderType)
									, m_spec		(spec)
									, m_numValues	(numValues)
									, m_name		(name)
									, m_executor	(createExecutor(context, m_shaderType, m_spec))
								{
								}